

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

SymOpnd * __thiscall IR::SymOpnd::CloneDefInternal(SymOpnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *pSVar4;
  StackSym *pSVar5;
  SymOpnd *pSVar6;
  
  if ((this->super_Opnd).m_kind != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x2cd,"(m_kind == OpndKindSym)","m_kind == OpndKindSym");
    if (!bVar2) goto LAB_005a4b87;
    *puVar3 = 0;
  }
  pSVar5 = (StackSym *)this->m_sym;
  if (((pSVar5->super_Sym).m_kind == SymKindStack) &&
     (pSVar4 = Sym::AsStackSym((Sym *)pSVar5), (pSVar4->field_0x18 & 1) != 0)) {
    pSVar4 = Sym::AsStackSym((Sym *)pSVar5);
    pSVar5 = StackSym::CloneDef(pSVar4,func);
    pSVar5 = Sym::AsStackSym(&pSVar5->super_Sym);
    if ((func->topFunc->m_cloner->clonedInstrGetOrigArgSlotSym == true) &&
       (bVar2 = StackSym::IsArgSlotSym(pSVar4), bVar2)) {
      if (pSVar5 == pSVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                           ,0x2d6,"(newSym != oldSym)","newSym != oldSym");
        if (!bVar2) {
LAB_005a4b87:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      this->m_sym = &pSVar5->super_Sym;
      pSVar5->field_5 = pSVar4->field_5;
      (pSVar4->field_5).m_instrDef = (Instr *)0x0;
      pSVar5 = pSVar4;
    }
  }
  pSVar6 = New(&pSVar5->super_Sym,this->m_offset,(this->super_Opnd).m_type,func);
  return pSVar6;
}

Assistant:

SymOpnd *
SymOpnd::CloneDefInternal(Func *func)
{
    Assert(m_kind == OpndKindSym);
    Sym *sym = this->m_sym;

    if (sym->IsStackSym() && sym->AsStackSym()->m_isSingleDef)
    {
        StackSym * oldSym = sym->AsStackSym();
        StackSym * newSym = oldSym->CloneDef(func)->AsStackSym();
        if (func->GetCloner()->clonedInstrGetOrigArgSlotSym && oldSym->IsArgSlotSym())
        {
            Assert(newSym != oldSym);
            this->m_sym = newSym;
            newSym->m_instrDef = oldSym->m_instrDef;
            oldSym->m_instrDef = nullptr;
            sym = oldSym;
        }
        else
        {
            sym = newSym;
        }
    }

    SymOpnd * newOpnd = SymOpnd::New(sym, m_offset, m_type, func);

    return newOpnd;
}